

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O3

Msg * __thiscall util::logging::Msg::operator+(Msg *__return_storage_ptr__,Msg *this,longlong val)

{
  lcast_put_unsigned<std::char_traits<char>,_unsigned_long_long,_char> local_a8;
  undefined1 local_8e [39];
  char local_67 [7];
  char *local_60;
  char *local_58;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  
  result._M_dataplus._M_p = (pointer)0x0;
  result._M_string_length._0_1_ = 0;
  local_60 = local_8e;
  local_a8.m_value = -val;
  if (0 < val) {
    local_a8.m_value = val;
  }
  local_a8.m_czero = '0';
  local_a8.m_zero = 0x30;
  local_a8.m_finish = local_67;
  local_58 = local_67;
  local_50 = (undefined1  [8])&result._M_string_length;
  local_60 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_long_long,_char>::
             convert(&local_a8);
  if (val < 0) {
    local_60[-1] = '-';
    local_60 = local_60 + -1;
  }
  local_58 = local_67;
  std::__cxx11::string::replace((ulong)local_50,0,result._M_dataplus._M_p,(ulong)local_60);
  operator+(__return_storage_ptr__,this,(string *)local_50);
  if (local_50 != (undefined1  [8])&result._M_string_length) {
    operator_delete((void *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Msg Msg::operator+( long long val )
		{
			return operator+( boost::lexical_cast<std::string>(val) );
		}